

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_linkpool_test.c
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  long *plVar7;
  long *plVar8;
  undefined8 *puVar9;
  long *plVar10;
  long *plVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  int iVar14;
  long *in_FS_OFFSET;
  
  int_linkpool_init();
  lVar1 = *in_FS_OFFSET;
  lVar2 = in_FS_OFFSET[-5];
  int_linkpool_thrd_init();
  puVar3 = (undefined8 *)in_FS_OFFSET[-5];
  int_linkpool_grow(0x20);
  plVar4 = (long *)in_FS_OFFSET[-4];
  lVar5 = *plVar4;
  plVar6 = (long *)plVar4[1];
  *(long **)(lVar5 + 8) = plVar6;
  *plVar6 = lVar5;
  *plVar4 = 0;
  plVar4[1] = 0;
  int_linkpool_grow(0x20);
  plVar6 = (long *)in_FS_OFFSET[-4];
  lVar5 = *plVar6;
  plVar7 = (long *)plVar6[1];
  *(long **)(lVar5 + 8) = plVar7;
  *plVar7 = lVar5;
  *plVar6 = 0;
  plVar6[1] = 0;
  int_linkpool_grow(0x20);
  plVar7 = (long *)in_FS_OFFSET[-4];
  lVar5 = *plVar7;
  plVar8 = (long *)plVar7[1];
  *(long **)(lVar5 + 8) = plVar8;
  *plVar8 = lVar5;
  *plVar7 = 0;
  plVar7[1] = 0;
  puVar9 = (undefined8 *)in_FS_OFFSET[-5];
  *(undefined4 *)(plVar4 + 2) = 0x3039;
  testfunc_linkpool_init();
  testfunc_linkpool_thrd_init();
  testfunc_linkpool_grow(0x20);
  plVar8 = (long *)in_FS_OFFSET[-1];
  lVar5 = *plVar8;
  plVar10 = (long *)plVar8[1];
  *(long **)(lVar5 + 8) = plVar10;
  *plVar10 = lVar5;
  *plVar8 = 0;
  plVar8[1] = 0;
  testfunc_linkpool_grow(0x20);
  plVar10 = (long *)in_FS_OFFSET[-1];
  lVar5 = *plVar10;
  plVar11 = (long *)plVar10[1];
  *(long **)(lVar5 + 8) = plVar11;
  *plVar11 = lVar5;
  *plVar10 = 0;
  plVar10[1] = 0;
  if (*plVar8 == 0) {
    puVar12 = (undefined8 *)in_FS_OFFSET[-1];
    plVar8[1] = (long)puVar12;
    *puVar12 = plVar8;
    *plVar8 = lVar1 + -0x10;
    in_FS_OFFSET[-1] = (long)plVar8;
    testfunc_linkpool_grow(0x20);
    plVar8 = (long *)in_FS_OFFSET[-1];
    lVar5 = *plVar8;
    plVar10 = (long *)plVar8[1];
    *(long **)(lVar5 + 8) = plVar10;
    *plVar10 = lVar5;
    *plVar8 = 0;
    plVar8[1] = 0;
    plVar8[2] = (long)testfunc_increment;
    iVar14 = (int)plVar4[2] + 1;
    *(int *)(plVar4 + 2) = iVar14;
    if (*plVar4 == 0) {
      puVar12 = (undefined8 *)(lVar1 + -0x28);
      puVar13 = (undefined8 *)in_FS_OFFSET[-4];
      plVar4[1] = (long)puVar13;
      *puVar13 = plVar4;
      *plVar4 = (long)puVar12;
      in_FS_OFFSET[-4] = (long)plVar4;
      if (*plVar6 == 0) {
        plVar6[1] = (long)plVar4;
        *plVar4 = (long)plVar6;
        *plVar6 = (long)puVar12;
        in_FS_OFFSET[-4] = (long)plVar6;
        if (*plVar7 == 0) {
          plVar7[1] = (long)plVar6;
          *plVar6 = (long)plVar7;
          *plVar7 = (long)puVar12;
          in_FS_OFFSET[-4] = (long)plVar7;
          puVar13 = (undefined8 *)in_FS_OFFSET[-5];
          if (puVar13 != (undefined8 *)0x0) {
            uo_queue_enqueue(int_linkpool_queue,(void *)in_FS_OFFSET[-6],true);
            *puVar12 = 0;
            *(undefined8 *)(lVar1 + -0x20) = 0;
          }
          if (in_FS_OFFSET[-2] != 0) {
            uo_queue_enqueue(testfunc_linkpool_queue,(void *)in_FS_OFFSET[-3],true);
            *(undefined8 *)(lVar1 + -0x10) = 0;
            *(undefined8 *)(lVar1 + -8) = 0;
          }
          return (int)(((puVar9 == puVar12 || (lVar2 != 0 || puVar3 != puVar12)) ||
                       puVar13 == puVar12) || iVar14 != 0x303a);
        }
      }
    }
  }
  __assert_fail("!uo__linklist_is_linked(link)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UoLeevi[P]libuo/uo_linklist/src/include/uo_linklist/uo_linklist.h"
                ,0xa6,"void uo__linklist_link(uo_linklist *, uo_linklist *)");
}

Assistant:

int main(
    int argc, 
    char const **argv)
{
    bool passed = true;

    passed &= int_linkpool_init();
    passed &= !int_linkpool_is_thrd_init();
    passed &= int_linkpool_thrd_init();
    passed &= int_linkpool_is_thrd_init();
    passed &= int_linkpool_is_empty();

    int_linklist *i0 = int_linkpool_rent();
    int_linklist *i1 = int_linkpool_rent();
    int_linklist *i2 = int_linkpool_rent();

    passed &= !int_linkpool_is_empty();

    i0->item = 12345;
    passed &= i0->item == 12345;

    passed &= testfunc_linkpool_init();
    passed &= testfunc_linkpool_thrd_init();

    testfunc_linklist *f0 = testfunc_linkpool_rent();
    testfunc_linklist *f1 = testfunc_linkpool_rent();
    testfunc_linkpool_return(f0);
    f0 = testfunc_linkpool_rent();

    f0->item = testfunc_increment;

    f0->item(&i0->item);

    passed &= i0->item == 12346;

    int_linkpool_return(i0);
    int_linkpool_return(i1);
    int_linkpool_return(i2);

    passed &= !int_linkpool_is_empty();

    int_linkpool_thrd_quit();
    testfunc_linkpool_thrd_quit();

    return passed ? 0 : 1;
}